

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

int MPLSParser::composeUHD_metadata(uint8_t *buffer,int bufferSize)

{
  long lVar1;
  BitStreamWriter writer;
  
  writer.super_BitStream.m_totalBits = 0;
  writer.m_curVal = 0;
  writer.m_bitWrited = 0;
  writer.super_BitStream.m_buffer = (uint *)0x0;
  writer.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamWriter::setBuffer(&writer,buffer,buffer + bufferSize);
  BitStreamWriter::putBits(&writer,0x20,0x20);
  BitStreamWriter::putBits(&writer,0x20,0x1000000);
  BitStreamWriter::putBits(&writer,0x20,0x10000000);
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 4) {
    BitStreamWriter::putBits(&writer,0x20,*(uint *)((long)HDR10_metadata + lVar1));
  }
  BitStreamWriter::flushBits(&writer);
  return (int)(((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8
              + writer.m_bitWrited) / 8;
}

Assistant:

int MPLSParser::composeUHD_metadata(uint8_t* buffer, const int bufferSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    try
    {
        writer.putBits(32, 0x20);
        writer.putBits(32, 1 << 24);
        writer.putBits(32, 1 << 28);
        for (const unsigned i : HDR10_metadata) writer.putBits(32, i);
        writer.flushBits();
        return writer.getBitsCount() / 8;
    }
    catch (...)
    {
        return 0;
    }
}